

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pulseaudio.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_23de0c::PulseCapture::~PulseCapture(PulseCapture *this)

{
  BackendBase *in_RDI;
  bool bVar1;
  undefined4 in_stack_fffffffffffffff0;
  uint uVar2;
  
  bVar1 = in_RDI[0xe]._vptr_BackendBase != (_func_int **)0x0;
  if (bVar1) {
    PulseMainloop::close((PulseMainloop *)(in_RDI + 1),(int)in_RDI[0xe]._vptr_BackendBase);
    in_RDI[0xe]._vptr_BackendBase = (_func_int **)0x0;
    in_RDI[0xd].mDevice = (ALCdevice *)0x0;
  }
  uVar2 = (uint)!bVar1;
  std::__cxx11::string::~string((string *)&in_RDI[7].mDevice);
  PulseMainloop::~PulseMainloop((PulseMainloop *)CONCAT44(uVar2,in_stack_fffffffffffffff0));
  BackendBase::~BackendBase(in_RDI);
  return;
}

Assistant:

PulseCapture::~PulseCapture()
{
    if(!mContext)
        return;

    mMainloop.close(mContext, mStream);
    mContext = nullptr;
    mStream = nullptr;
}